

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_math.h
# Opt level: O2

uint lzham::math::floor_log2i(uint v)

{
  uint l;
  
  l = 0;
  for (; 1 < v; v = v >> 1) {
    l = l + 1;
  }
  return l;
}

Assistant:

inline uint floor_log2i(uint v)
      {
         uint l = 0;
         while (v > 1U)
         {
            v >>= 1;
            l++;
         }
         return l;
      }